

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_font_x.cxx
# Opt level: O3

void __thiscall
Fl_Xlib_Graphics_Driver::text_extents
          (Fl_Xlib_Graphics_Driver *this,char *c,int n,int *dx,int *dy,int *W,int *H)

{
  int iVar1;
  Fl_Font_Descriptor *pFVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int hh;
  int ww;
  int yy;
  int xx;
  ulong local_38;
  
  uVar6 = (ulong)(uint)n;
  if (font_gc != fl_gc) {
    pFVar2 = (this->super_Fl_Graphics_Driver).font_descriptor_;
    local_38 = uVar6;
    if (pFVar2 == (Fl_Font_Descriptor *)0x0) {
      (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x36])
                (this,0,(ulong)(uint)FL_NORMAL_SIZE);
      pFVar2 = (this->super_Fl_Graphics_Driver).font_descriptor_;
    }
    font_gc = fl_gc;
    XSetFont(fl_display,fl_gc,pFVar2->font->fid);
    uVar6 = local_38;
  }
  hh = 0;
  ww = 0;
  yy = 0;
  xx = 0;
  iVar1 = 0;
  iVar5 = 0;
  iVar4 = 0;
  iVar3 = 0;
  if (fl_gc != (GC)0x0) {
    XUtf8_measure_extents
              (fl_display,fl_window,((this->super_Fl_Graphics_Driver).font_descriptor_)->font,fl_gc,
               &xx,&yy,&ww,&hh,c,(int)uVar6);
    iVar1 = yy;
    iVar5 = ww;
    iVar4 = hh;
    iVar3 = xx;
  }
  *W = iVar5;
  *H = iVar4;
  *dx = iVar3;
  *dy = iVar1;
  return;
}

Assistant:

void Fl_Xlib_Graphics_Driver::text_extents(const char *c, int n, int &dx, int &dy, int &W, int &H) {
  if (font_gc != fl_gc) {
    if (!font_descriptor()) font(FL_HELVETICA, FL_NORMAL_SIZE);
    font_gc = fl_gc;
    XSetFont(fl_display, fl_gc, font_descriptor()->font->fid);
  }
  int xx, yy, ww, hh;
  xx = yy = ww = hh = 0;
  if (fl_gc) XUtf8_measure_extents(fl_display, fl_window, font_descriptor()->font, fl_gc, &xx, &yy, &ww, &hh, c, n);

  W = ww; H = hh; dx = xx; dy = yy;
// This is the safe but mostly wrong thing we used to do...
//  W = 0; H = 0;
//  fl_measure(c, W, H, 0);
//  dx = 0;
//  dy = fl_descent() - H;
}